

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay_linux.hpp
# Opt level: O0

void install_trivial_crash_handlers(ThreadedReplayer *replayer)

{
  undefined1 local_a8 [8];
  sigaction act;
  ThreadedReplayer *replayer_local;
  
  global_replayer = replayer;
  act.sa_restorer = (_func_void *)replayer;
  memset(local_a8,0,0x98);
  sigemptyset((sigset_t *)&act);
  local_a8 = (undefined1  [8])crash_handler_trivial;
  act.sa_mask.__val[0xf]._0_4_ = 0x80000000;
  sigaction(0xb,(sigaction *)local_a8,(sigaction *)0x0);
  sigaction(8,(sigaction *)local_a8,(sigaction *)0x0);
  sigaction(4,(sigaction *)local_a8,(sigaction *)0x0);
  sigaction(7,(sigaction *)local_a8,(sigaction *)0x0);
  sigaction(6,(sigaction *)local_a8,(sigaction *)0x0);
  return;
}

Assistant:

static void install_trivial_crash_handlers(ThreadedReplayer &replayer)
{
	global_replayer = &replayer;

	struct sigaction act;
	memset(&act, 0, sizeof(act));
	sigemptyset(&act.sa_mask);
	act.sa_handler = crash_handler_trivial;
	act.sa_flags = SA_RESETHAND;

	sigaction(SIGSEGV, &act, nullptr);
	sigaction(SIGFPE, &act, nullptr);
	sigaction(SIGILL, &act, nullptr);
	sigaction(SIGBUS, &act, nullptr);
	sigaction(SIGABRT, &act, nullptr);
}